

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_impl.cc
# Opt level: O0

void absl::lts_20250127::time_internal::cctz::time_zone::Impl::ClearTimeZoneMapTestOnly(void)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>_>
  *this;
  bool bVar1;
  int iVar2;
  mutex *__m;
  deque<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>
  *this_00;
  reference ppVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>
  *element;
  iterator __end4;
  iterator __begin4;
  TimeZoneImplByName *__range4;
  lock_guard<std::mutex> local_10;
  lock_guard<std::mutex> lock;
  
  __m = anon_unknown_7::TimeZoneMutex();
  std::lock_guard<std::mutex>::lock_guard(&local_10,__m);
  if ((anonymous_namespace)::time_zone_map_abi_cxx11_ !=
      (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>_>
       *)0x0) {
    if (ClearTimeZoneMapTestOnly()::cleared == '\0') {
      iVar2 = __cxa_guard_acquire(&ClearTimeZoneMapTestOnly()::cleared);
      if (iVar2 != 0) {
        this_00 = (deque<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>
                   *)operator_new(0x50);
        std::
        deque<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>
        ::deque(this_00);
        ClearTimeZoneMapTestOnly::cleared = this_00;
        __cxa_guard_release(&ClearTimeZoneMapTestOnly()::cleared);
      }
    }
    this = (anonymous_namespace)::time_zone_map_abi_cxx11_;
    __end4 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>_>
             ::begin((anonymous_namespace)::time_zone_map_abi_cxx11_);
    element = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>
               *)std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>_>
                 ::end(this);
    while( true ) {
      bVar1 = std::__detail::operator!=
                        (&__end4.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_true>
                         ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_true>
                           *)&element);
      if (!bVar1) break;
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_false,_true>
               ::operator*(&__end4);
      std::
      deque<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>
      ::push_back(ClearTimeZoneMapTestOnly::cleared,&ppVar3->second);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_false,_true>
      ::operator++(&__end4);
    }
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>_>
    ::clear((anonymous_namespace)::time_zone_map_abi_cxx11_);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_10);
  return;
}

Assistant:

void time_zone::Impl::ClearTimeZoneMapTestOnly() {
  std::lock_guard<std::mutex> lock(TimeZoneMutex());
  if (time_zone_map != nullptr) {
    // Existing time_zone::Impl* entries are in the wild, so we can't delete
    // them. Instead, we move them to a private container, where they are
    // logically unreachable but not "leaked".  Future requests will result
    // in reloading the data.
    static auto* cleared = new std::deque<const time_zone::Impl*>;
    for (const auto& element : *time_zone_map) {
      cleared->push_back(element.second);
    }
    time_zone_map->clear();
  }
}